

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListFlattenBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  reference pvVar3;
  pointer pEVar4;
  LogicalType *pLVar5;
  reference pvVar6;
  LogicalType *pLVar7;
  undefined1 *puVar8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  undefined8 local_68 [3];
  LogicalType child_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if (pEVar4[0x38] == (Expression)0x6c) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    pLVar5 = (LogicalType *)duckdb::ArrayType::GetChildType((LogicalType *)(pEVar4 + 0x38));
    duckdb::LogicalType::LogicalType(&child_type,pLVar5);
    if (child_type == (LogicalType)0x6c) {
      duckdb::ArrayType::GetChildType(&child_type);
      duckdb::LogicalType::LIST((LogicalType *)local_68);
      LogicalType::operator=(&child_type,(LogicalType *)local_68);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    local_30._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    duckdb::LogicalType::LIST((LogicalType *)local_68);
    duckdb::BoundCastExpression::AddCastToType(&local_70,context,&local_30,local_68,0);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    _Var2._M_head_impl = local_70._M_head_impl;
    local_70._M_head_impl = (Expression *)0x0;
    _Var1._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    }
    if (local_70._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
    local_70._M_head_impl = (Expression *)0x0;
    duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
    if (local_30._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
    local_30._M_head_impl = (Expression *)0x0;
  }
  else {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    if (pEVar4[0x38] != (Expression)0x65) goto LAB_007149e0;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    pLVar5 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pEVar4 + 0x38));
    duckdb::LogicalType::LogicalType(&child_type,pLVar5);
    if (child_type == (LogicalType)0x6c) {
      duckdb::ArrayType::GetChildType(&child_type);
      duckdb::LogicalType::LIST((LogicalType *)local_68);
      LogicalType::operator=(&child_type,(LogicalType *)local_68);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      local_38._M_head_impl =
           (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      duckdb::LogicalType::LIST((LogicalType *)local_68);
      duckdb::BoundCastExpression::AddCastToType(&local_70,context,&local_38,local_68,0);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      _Var2._M_head_impl = local_70._M_head_impl;
      local_70._M_head_impl = (Expression *)0x0;
      _Var1._M_head_impl =
           (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)_Var1._M_head_impl + 8))();
      }
      if (local_70._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
      local_70._M_head_impl = (Expression *)0x0;
      duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
      if (local_38._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
      local_38._M_head_impl = (Expression *)0x0;
    }
  }
  duckdb::LogicalType::~LogicalType(&child_type);
LAB_007149e0:
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  pLVar5 = (LogicalType *)(pEVar4 + 0x38);
  puVar8 = &bound_function->field_0x48;
  pvVar6 = vector<duckdb::LogicalType,_true>::get<true>
                     ((vector<duckdb::LogicalType,_true> *)puVar8,0);
  LogicalType::operator=(pvVar6,pLVar5);
  if (pEVar4[0x38] == (Expression)0x2) {
    duckdb::LogicalType::LogicalType(&child_type,UNKNOWN);
    pvVar6 = vector<duckdb::LogicalType,_true>::get<true>
                       ((vector<duckdb::LogicalType,_true> *)puVar8,0);
    LogicalType::operator=(pvVar6,&child_type);
    duckdb::LogicalType::~LogicalType(&child_type);
    duckdb::LogicalType::LogicalType(&child_type,SQLNULL);
    LogicalType::operator=((LogicalType *)&bound_function->field_0x90,&child_type);
    duckdb::LogicalType::~LogicalType(&child_type);
    *(undefined8 *)this = 0;
  }
  else {
    pLVar7 = (LogicalType *)duckdb::ListType::GetChildType(pLVar5);
    duckdb::LogicalType::LogicalType(&child_type,pLVar7);
    if (child_type == (LogicalType)0x2) {
      duckdb::LogicalType::LogicalType((LogicalType *)local_68,UNKNOWN);
      pvVar6 = vector<duckdb::LogicalType,_true>::get<true>
                         ((vector<duckdb::LogicalType,_true> *)puVar8,0);
      LogicalType::operator=(pvVar6,(LogicalType *)local_68);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
      duckdb::LogicalType::LogicalType((LogicalType *)local_68,SQLNULL);
      LogicalType::operator=((LogicalType *)&bound_function->field_0x90,(LogicalType *)local_68);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
      *(undefined8 *)this = 0;
    }
    else {
      puVar8 = &bound_function->field_0x90;
      if (child_type == (LogicalType)0x1) {
        LogicalType::operator=((LogicalType *)puVar8,pLVar5);
        make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>
                  ((duckdb *)local_68,(LogicalType *)puVar8);
      }
      else {
        LogicalType::operator=((LogicalType *)puVar8,&child_type);
        make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>
                  ((duckdb *)local_68,(LogicalType *)puVar8);
      }
      *(undefined8 *)this = local_68[0];
    }
    duckdb::LogicalType::~LogicalType(&child_type);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListFlattenBind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 1);

	if (arguments[0]->return_type.id() == LogicalTypeId::ARRAY) {
		auto child_type = ArrayType::GetChildType(arguments[0]->return_type);
		if (child_type.id() == LogicalTypeId::ARRAY) {
			child_type = LogicalType::LIST(ArrayType::GetChildType(child_type));
		}
		arguments[0] =
		    BoundCastExpression::AddCastToType(context, std::move(arguments[0]), LogicalType::LIST(child_type));
	} else if (arguments[0]->return_type.id() == LogicalTypeId::LIST) {
		auto child_type = ListType::GetChildType(arguments[0]->return_type);
		if (child_type.id() == LogicalTypeId::ARRAY) {
			child_type = LogicalType::LIST(ArrayType::GetChildType(child_type));
			arguments[0] =
			    BoundCastExpression::AddCastToType(context, std::move(arguments[0]), LogicalType::LIST(child_type));
		}
	}

	auto &input_type = arguments[0]->return_type;
	bound_function.arguments[0] = input_type;
	if (input_type.id() == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalType(LogicalTypeId::UNKNOWN);
		bound_function.return_type = LogicalType(LogicalTypeId::SQLNULL);
		return nullptr;
	}
	D_ASSERT(input_type.id() == LogicalTypeId::LIST);

	auto child_type = ListType::GetChildType(input_type);
	if (child_type.id() == LogicalType::SQLNULL) {
		bound_function.return_type = input_type;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}
	if (child_type.id() == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalType(LogicalTypeId::UNKNOWN);
		bound_function.return_type = LogicalType(LogicalTypeId::SQLNULL);
		return nullptr;
	}
	D_ASSERT(child_type.id() == LogicalTypeId::LIST);

	bound_function.return_type = child_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}